

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O1

enable_if_t<HasSize<vector<Bounds2<float>_>_>::value_&&_HasData<vector<Bounds2<float>_>_>::value,_std::ostream_&>
 pbrt::detail::operator<<
           (ostream *os,
           vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_> *v
           )

{
  ulong uVar1;
  Bounds2<float> *this;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ ",2);
  if (v->nStored != 0) {
    this = v->ptr;
    uVar1 = 0;
    do {
      Bounds2<float>::ToString_abi_cxx11_(&local_50,this);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (uVar1 < v->nStored - 1) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      uVar1 = uVar1 + 1;
      this = this + 1;
    } while (uVar1 < v->nStored);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return os;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}